

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  char cVar1;
  int iVar2;
  GCObject *pGVar3;
  bool bVar4;
  int iVar5;
  TValue *i_o;
  char *pcVar6;
  StkId pTVar7;
  GCObject *t;
  global_State *pgVar8;
  TValue *pTVar9;
  char *pcVar10;
  GCObject *pGVar11;
  char *source;
  CallInfo *ci;
  long lVar12;
  
  if (*what == '>') {
    what = what + 1;
    pGVar11 = L->top[-1].value.gc;
    L->top = L->top + -1;
    ci = (CallInfo *)0x0;
LAB_001097cf:
    if (pGVar11 != (GCObject *)0x0) {
      pcVar6 = what;
      do {
        cVar1 = *pcVar6;
        iVar5 = -1;
        if (cVar1 == 'S') {
          if ((pGVar11->h).flags == '\0') {
            source = (char *)&(((pGVar11->th).l_G)->grayagain->h).array;
            ar->source = source;
            iVar2 = (int)(((pGVar11->th).l_G)->buff).n;
            ar->linedefined = iVar2;
            iVar5 = *(int *)((long)&(((pGVar11->th).l_G)->buff).n + 4);
            pcVar10 = "Lua";
            if (iVar2 == 0) {
              pcVar10 = "main";
            }
          }
          else {
            source = "=[C]";
            ar->source = "=[C]";
            ar->linedefined = -1;
            pcVar10 = "C";
          }
          ar->lastlinedefined = iVar5;
          ar->what = pcVar10;
          luaO_chunkid(ar->short_src,source,0x3c);
        }
        else if (cVar1 == 'l') {
          if (ci != (CallInfo *)0x0) {
            iVar5 = currentline(L,ci);
          }
          ar->currentline = iVar5;
        }
        else if (cVar1 == 'n') {
          ar->namewhat = "";
          ar->name = (char *)0x0;
        }
        else if (cVar1 == 'u') {
          ar->nups = (uint)(pGVar11->h).lsizenode;
        }
        else if (cVar1 == '\0') goto LAB_001098b9;
        pcVar6 = pcVar6 + 1;
      } while( true );
    }
  }
  else {
    lVar12 = (long)ar->i_ci;
    if (lVar12 != 0) {
      ci = L->base_ci + lVar12;
      pGVar11 = ((L->base_ci[lVar12].func)->value).gc;
      goto LAB_001097cf;
    }
  }
  ar->namewhat = "";
  ar->name = "";
  ar->what = "tail";
  ar->currentline = -1;
  ar->linedefined = -1;
  ar->lastlinedefined = -1;
  ar->source = "=(tail call)";
  luaO_chunkid(ar->short_src,"=(tail call)",0x3c);
  ar->nups = 0;
  bVar4 = true;
  pGVar11 = (GCObject *)0x0;
LAB_0010990c:
  pcVar6 = strchr(what,0x66);
  if (pcVar6 != (char *)0x0) {
    pTVar7 = L->top;
    if (bVar4) {
      pTVar7->tt = 0;
    }
    else {
      (pTVar7->value).gc = pGVar11;
      pTVar7->tt = 6;
      pTVar7 = L->top;
    }
    if ((long)L->stack_last - (long)pTVar7 < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
  }
  pTVar7 = (StkId)strchr(what,0x4c);
  if (pTVar7 != (StkId)0x0) {
    if ((bVar4) || ((pGVar11->h).flags != '\0')) {
      pTVar7 = L->top;
      pTVar7->tt = 0;
    }
    else {
      t = (GCObject *)luaH_new(L,0,0);
      pgVar8 = (pGVar11->th).l_G;
      pGVar3 = pgVar8->rootgc;
      for (lVar12 = 0; lVar12 < *(int *)((long)&pgVar8->tmudata + 4); lVar12 = lVar12 + 1) {
        pTVar9 = luaH_setnum(L,&t->h,*(int *)((long)pGVar3 + lVar12 * 4));
        (pTVar9->value).b = 1;
        pTVar9->tt = 1;
        pgVar8 = (pGVar11->th).l_G;
      }
      pTVar7 = L->top;
      (pTVar7->value).gc = t;
      pTVar7->tt = 5;
      pTVar7 = L->top;
    }
    if ((long)L->stack_last - (long)pTVar7 < 0x11) {
      luaD_growstack(L,1);
      pTVar7 = L->top;
    }
    pTVar7 = pTVar7 + 1;
    L->top = pTVar7;
  }
  return (int)pTVar7;
LAB_001098b9:
  bVar4 = false;
  goto LAB_0010990c;
}

Assistant:

static int lua_getinfo(lua_State*L,const char*what,lua_Debug*ar){
int status;
Closure*f=NULL;
CallInfo*ci=NULL;
if(*what=='>'){
StkId func=L->top-1;
luai_apicheck(L,ttisfunction(func));
what++;
f=clvalue(func);
L->top--;
}
else if(ar->i_ci!=0){
ci=L->base_ci+ar->i_ci;
f=clvalue(ci->func);
}
status=auxgetinfo(L,what,ar,f,ci);
if(strchr(what,'f')){
if(f==NULL)setnilvalue(L->top);
else setclvalue(L,L->top,f);
incr_top(L);
}
if(strchr(what,'L'))
collectvalidlines(L,f);
return status;
}